

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O2

void __thiscall
icu_63::TimeZoneNamesImpl::ZoneStringsLoader::put
          (ZoneStringsLoader *this,char *key,ResourceValue *value,UBool noFallback,
          UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  int32_t i;
  int i_00;
  ResourceTable timeZonesTable;
  char *local_68;
  ZoneStringsLoader *local_60;
  ResourceTable local_58;
  
  local_68 = key;
  local_60 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])(&local_58,value,status);
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    i_00 = 0;
    do {
      UVar1 = ResourceTable::getKeyAndValue(&local_58,i_00,&local_68,value);
      if (UVar1 == '\0') {
        return;
      }
      iVar2 = (*(value->super_UObject)._vptr_UObject[3])(value);
      if (iVar2 == 2) {
        consumeNamesTable(local_60,local_68,value,noFallback,status);
      }
      i_00 = i_00 + 1;
    } while (*status < U_ILLEGAL_ARGUMENT_ERROR);
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool noFallback,
            UErrorCode &status) {
        ResourceTable timeZonesTable = value.getTable(status);
        if (U_FAILURE(status)) { return; }
        for (int32_t i = 0; timeZonesTable.getKeyAndValue(i, key, value); ++i) {
            U_ASSERT(!value.isNoInheritanceMarker());
            if (value.getType() == URES_TABLE) {
                consumeNamesTable(key, value, noFallback, status);
            } else {
                // Ignore fields that aren't tables (e.g., fallbackFormat and regionFormatStandard).
                // All time zone fields are tables.
            }
            if (U_FAILURE(status)) { return; }
        }
    }